

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<long>::Subst_Forward(TPZMatrix<long> *this,TPZFMatrix<long> *B)

{
  TPZBaseMatrix *pTVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  long sum;
  int64_t c;
  long pivot;
  int64_t r;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar3 == lVar4) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = 0;
    while( true ) {
      lVar4 = local_20;
      lVar5 = (**(code **)(*in_RDI + 0x60))();
      if (lVar5 <= lVar4) break;
      local_28 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_20);
      local_30 = 0;
      while( true ) {
        lVar4 = local_30;
        iVar3 = TPZBaseMatrix::Cols(local_18);
        if (iVar3 <= lVar4) break;
        local_38 = 0;
        for (local_40 = 0; pTVar1 = local_18, lVar5 = local_20, lVar4 = local_30,
            local_40 < local_20; local_40 = local_40 + 1) {
          lVar4 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_40);
          iVar2 = (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_40,local_30)
          ;
          local_38 = lVar4 * CONCAT44(extraout_var,iVar2) + local_38;
        }
        iVar2 = (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_20,local_30);
        local_48 = (CONCAT44(extraout_var_00,iVar2) - local_38) / local_28;
        (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar1,lVar5,lVar4,&local_48);
        local_30 = local_30 + 1;
      }
      local_20 = local_20 + 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}